

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdFinalizeMultisigScript
              (void *handle,void *multisig_handle,uint32_t require_num,char **address,
              char **redeem_script,char **witness_script)

{
  pointer pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  bool bVar4;
  AddressType AVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  CfdException *pCVar9;
  char *pcVar10;
  ulong uVar11;
  Script *this;
  bool is_bitcoin;
  char *work_redeem_script;
  char *work_address;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  AddressFactory factory;
  Script multisig_script;
  Script witness_script_obj;
  Script redeem_script_obj;
  Address addr;
  Script script;
  bool local_489;
  char *local_488;
  char *local_480;
  void *local_478;
  undefined8 local_470;
  AddressType local_464;
  NetType local_460;
  uint32_t local_45c;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_458;
  char **local_440;
  char **local_438;
  char **local_430;
  AddressFactory local_428;
  Script local_400;
  Script local_3c8;
  Script local_390;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  pointer local_328;
  pointer local_310;
  pointer local_2f8;
  TapBranch local_2e0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_268;
  Script local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  pointer local_1b0;
  pointer local_198;
  pointer local_180;
  TapBranch local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f0;
  Script local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Script local_68;
  
  local_480 = (char *)0x0;
  local_488 = (char *)0x0;
  local_470 = 0;
  local_478 = handle;
  local_45c = require_num;
  cfd::Initialize();
  pcVar1 = local_1e0 + 0x10;
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"MultisigScript","");
  cfd::capi::CheckBuffer(multisig_handle,(string *)local_1e0);
  if ((pointer)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if (*(uint *)((long)multisig_handle + 0xa54) == 0) {
    local_1e0._0_8_ = "cfdcapi_address.cpp";
    local_1e0._8_4_ = 0x134;
    local_1e0._16_8_ = "CfdFinalizeMultisigScript";
    cfd::core::logger::log<>((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"pubkey not found.")
    ;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to parameter. pubkey not found.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (0x14 < *(uint *)((long)multisig_handle + 0xa54)) {
    local_1e0._0_8_ = "cfdcapi_address.cpp";
    local_1e0._8_4_ = 0x13b;
    local_1e0._16_8_ = "CfdFinalizeMultisigScript";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,
               "The number of pubkey has reached the upper limit.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"The number of pubkey has reached the upper limit.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdOutOfRangeError,(string *)local_1e0);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_489 = false;
  local_460 = cfd::capi::ConvertNetType(*(int *)((long)multisig_handle + 0x10),&local_489);
  cfd::core::Address::Address((Address *)local_1e0);
  AVar5 = cfd::capi::ConvertHashToAddressType(0);
  local_458.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_68);
  local_464 = AVar5;
  cfd::core::Script::Script(&local_390);
  local_440 = address;
  local_438 = redeem_script;
  local_430 = witness_script;
  cfd::core::Script::Script(&local_3c8);
  if (*(int *)((long)multisig_handle + 0xa54) != 0) {
    pcVar10 = (char *)((long)multisig_handle + 0x18);
    uVar11 = 0;
    do {
      local_358._0_8_ = local_358 + 0x10;
      sVar6 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,pcVar10,pcVar10 + sVar6);
      std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>::
      emplace_back<std::__cxx11::string>
                ((vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>> *)&local_458,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_);
      }
      uVar11 = uVar11 + 1;
      pcVar10 = pcVar10 + 0x83;
    } while (uVar11 < *(uint *)((long)multisig_handle + 0xa54));
  }
  AVar5 = local_464;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_400,local_45c,&local_458,local_464 != kP2shAddress);
  ppcVar3 = local_430;
  ppcVar2 = local_438;
  if (local_489 == true) {
    cfd::AddressFactory::AddressFactory(&local_428,local_460);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_358,&local_428,AVar5,(Pubkey *)0x0,&local_400,(Script *)0x0,
               &local_390);
    cfd::core::Address::operator=((Address *)local_1e0,(Address *)local_358);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory
              ((ElementsAddressFactory *)&local_428,local_460);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_358,&local_428,AVar5,(Pubkey *)0x0,&local_400,(Script *)0x0,
               &local_390);
    cfd::core::Address::operator=((Address *)local_1e0,(Address *)local_358);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_210);
  cfd::core::Script::~Script(&local_250);
  local_2e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_268);
  cfd::core::TapBranch::~TapBranch(&local_2e0);
  if (local_2f8 != (pointer)0x0) {
    operator_delete(local_2f8);
  }
  if (local_310 != (pointer)0x0) {
    operator_delete(local_310);
  }
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328);
  }
  if ((undefined1 *)local_358._16_8_ != local_338) {
    operator_delete((void *)local_358._16_8_);
  }
  local_428._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_428.prefix_list_);
  this = &local_390;
  if (AVar5 != kP2shAddress) {
    this = &local_3c8;
  }
  cfd::core::Script::operator=(this,&local_400);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_358,(Address *)local_1e0);
  pcVar10 = cfd::capi::CreateString((string *)local_358);
  pcVar1 = local_358 + 0x10;
  local_480 = pcVar10;
  if ((pointer)local_358._0_8_ != pcVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (ppcVar2 == (char **)0x0) {
LAB_003d5ab5:
    pcVar7 = (char *)0x0;
  }
  else {
    bVar4 = cfd::core::Script::IsEmpty(&local_390);
    if (bVar4) goto LAB_003d5ab5;
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_358,&local_390);
    pcVar7 = cfd::capi::CreateString((string *)local_358);
    local_488 = pcVar7;
    if ((pointer)local_358._0_8_ != pcVar1) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  if (ppcVar3 != (char **)0x0) {
    bVar4 = cfd::core::Script::IsEmpty(&local_3c8);
    if (!bVar4) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_358,&local_3c8);
      pcVar8 = cfd::capi::CreateString((string *)local_358);
      if ((pointer)local_358._0_8_ != pcVar1) {
        operator_delete((void *)local_358._0_8_);
      }
      goto LAB_003d5b48;
    }
  }
  pcVar8 = (char *)0x0;
LAB_003d5b48:
  *local_440 = pcVar10;
  if (pcVar7 != (char *)0x0) {
    *ppcVar2 = pcVar7;
  }
  if (pcVar8 != (char *)0x0) {
    *ppcVar3 = pcVar8;
  }
  cfd::core::Script::~Script(&local_400);
  cfd::core::Script::~Script(&local_3c8);
  cfd::core::Script::~Script(&local_390);
  cfd::core::Script::~Script(&local_68);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_458);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  cfd::core::Script::~Script(&local_d8);
  local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_f0);
  cfd::core::TapBranch::~TapBranch(&local_168);
  if (local_180 != (pointer)0x0) {
    operator_delete(local_180);
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if ((undefined1 *)local_1e0._16_8_ != local_1c0) {
    operator_delete((void *)local_1e0._16_8_);
  }
  return 0;
}

Assistant:

int CfdFinalizeMultisigScript(
    void* handle, void* multisig_handle, uint32_t require_num, char** address,
    char** redeem_script, char** witness_script) {
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_witness_script = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "pubkey not found.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey not found.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    bool is_bitcoin = false;
    NetType net_type =
        cfd::capi::ConvertNetType(data->network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(data->hash_type);
    std::vector<Pubkey> pubkeys;
    Script script;
    Script redeem_script_obj;
    Script witness_script_obj;

    for (uint32_t index = 0; index < data->current_index; ++index) {
      pubkeys.emplace_back(std::string(data->pubkeys[index]));
    }
    bool has_witness = (addr_type != AddressType::kP2shAddress);
    Script multisig_script = ScriptUtil::CreateMultisigRedeemScript(
        require_num, pubkeys, has_witness);

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, nullptr, &multisig_script, nullptr, &redeem_script_obj);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (!has_witness) {
      redeem_script_obj = multisig_script;
    } else {
      witness_script_obj = multisig_script;
    }

    work_address = CreateString(addr.GetAddress());
    if (redeem_script != nullptr) {
      if (!redeem_script_obj.IsEmpty()) {
        work_redeem_script = CreateString(redeem_script_obj.GetHex());
      }
    }
    if (witness_script != nullptr) {
      if (!witness_script_obj.IsEmpty()) {
        work_witness_script = CreateString(witness_script_obj.GetHex());
      }
    }

    *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_witness_script != nullptr) *witness_script = work_witness_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_address, &work_redeem_script, &work_witness_script);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}